

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode curl_multi_assign(CURLM *multi_handle,curl_socket_t s,void *hashp)

{
  Curl_multi *multi;
  Curl_sh_entry *there;
  void *hashp_local;
  CURLM *pCStack_18;
  curl_socket_t s_local;
  CURLM *multi_handle_local;
  
  multi = (Curl_multi *)0x0;
  if (s != -1) {
    hashp_local._4_4_ = s;
    pCStack_18 = multi_handle;
    multi = (Curl_multi *)
            Curl_hash_pick((curl_hash *)((long)multi_handle + 0x88),(void *)((long)&hashp_local + 4)
                           ,4);
  }
  if (multi == (Curl_multi *)0x0) {
    multi_handle_local._4_4_ = CURLM_BAD_SOCKET;
  }
  else {
    multi->easylp = (SessionHandle *)hashp;
    multi_handle_local._4_4_ = CURLM_OK;
  }
  return multi_handle_local._4_4_;
}

Assistant:

CURLMcode curl_multi_assign(CURLM *multi_handle,
                            curl_socket_t s, void *hashp)
{
  struct Curl_sh_entry *there = NULL;
  struct Curl_multi *multi = (struct Curl_multi *)multi_handle;

  if(s != CURL_SOCKET_BAD)
    there = Curl_hash_pick(&multi->sockhash, (char *)&s,
                           sizeof(curl_socket_t));

  if(!there)
    return CURLM_BAD_SOCKET;

  there->socketp = hashp;

  return CURLM_OK;
}